

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O1

idx_t duckdb::FixedSizeAppend<int,duckdb::StandardFixedSizeAppend>
                (CompressionAppendState *append_state,ColumnSegment *segment,
                SegmentStatistics *stats,UnifiedVectorFormat *data,idx_t offset,idx_t count)

{
  atomic<unsigned_long> *paVar1;
  data_ptr_t target;
  idx_t iVar2;
  ulong count_00;
  
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(append_state->handle).node);
  target = ((append_state->handle).node.ptr)->buffer;
  iVar2 = ColumnSegment::SegmentSize(segment);
  count_00 = (iVar2 >> 2) -
             (segment->super_SegmentBase<duckdb::ColumnSegment>).count.
             super___atomic_base<unsigned_long>._M_i;
  if (count < count_00) {
    count_00 = count;
  }
  StandardFixedSizeAppend::Append<int>
            (stats,target,
             (segment->super_SegmentBase<duckdb::ColumnSegment>).count.
             super___atomic_base<unsigned_long>._M_i,data,offset,count_00);
  LOCK();
  paVar1 = &(segment->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + count_00;
  UNLOCK();
  return count_00;
}

Assistant:

idx_t FixedSizeAppend(CompressionAppendState &append_state, ColumnSegment &segment, SegmentStatistics &stats,
                      UnifiedVectorFormat &data, idx_t offset, idx_t count) {
	D_ASSERT(segment.GetBlockOffset() == 0);

	auto target_ptr = append_state.handle.Ptr();
	idx_t max_tuple_count = segment.SegmentSize() / sizeof(T);
	idx_t copy_count = MinValue<idx_t>(count, max_tuple_count - segment.count);

	OP::template Append<T>(stats, target_ptr, segment.count, data, offset, copy_count);
	segment.count += copy_count;
	return copy_count;
}